

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

int eval_predicate(lyxp_expr *exp,uint16_t *exp_idx,lyd_node *cur_node,lys_module *param_4,
                  lyxp_set *set,int options)

{
  uint32_t uVar1;
  uint8_t **ppuVar2;
  uint8_t *puVar3;
  lyxp_set_nodes *plVar4;
  longdouble lVar5;
  byte bVar6;
  ushort uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t idx;
  int iVar10;
  char *pcVar11;
  void *__ptr;
  void *pvVar12;
  ulong uVar13;
  LY_ERR *pLVar14;
  ulong uVar15;
  uint uVar16;
  char *pcVar17;
  long lVar18;
  uint uVar19;
  undefined4 uVar20;
  uint uVar21;
  undefined1 local_b8 [8];
  lyxp_set set2;
  
  if ('\x02' < ly_log_level) {
    pcVar17 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar17 = "skipped";
    }
    pcVar11 = print_token(exp->tokens[*exp_idx]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar17,pcVar11,
               (ulong)exp->expr_pos[*exp_idx]);
  }
  uVar8 = (uint)*exp_idx;
  uVar7 = *exp_idx + 1;
  *exp_idx = uVar7;
  if (set == (lyxp_set *)0x0) {
    iVar10 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)0x0,options);
    if (iVar10 != 0) {
      return iVar10;
    }
  }
  else {
    if (set->type == LYXP_SET_NODE_SET) {
      iVar10 = set_sort(set,cur_node,options);
      if (1 < iVar10) {
        pLVar14 = ly_errno_location();
        *pLVar14 = LY_EINT;
        ly_log(LY_LLERR,"XPath set was expected to be sorted, but is not (%s).","eval_predicate");
      }
      uVar7 = *exp_idx;
      uVar13 = (ulong)uVar7;
      uVar8 = (uint)uVar7;
      do {
        uVar15 = uVar13 & 0xffff;
        uVar9 = (uint)uVar13;
        uVar13 = (ulong)(uVar9 + 1);
      } while (exp->tokens[uVar15] != LYXP_TOKEN_BRACK2);
      uVar9 = (uVar9 & 0xffff) - uVar8;
      __ptr = calloc((long)(int)uVar9,8);
      if (__ptr == (void *)0x0) {
LAB_0016cf70:
        pLVar14 = ly_errno_location();
        *pLVar14 = LY_EMEM;
        ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
        return -1;
      }
      if (0 < (int)uVar9) {
        ppuVar2 = exp->repeat;
        uVar21 = 0;
        do {
          puVar3 = ppuVar2[uVar21 + uVar8];
          if (puVar3 != (uint8_t *)0x0) {
            bVar6 = 0;
            do {
              uVar13 = (ulong)bVar6;
              bVar6 = bVar6 + 1;
            } while (puVar3[uVar13] != '\0');
            pvVar12 = malloc((ulong)bVar6);
            *(void **)((long)__ptr + (ulong)uVar21 * 8) = pvVar12;
            if (pvVar12 == (void *)0x0) goto LAB_0016cff4;
            memcpy(pvVar12,puVar3,(ulong)bVar6);
          }
          uVar21 = uVar21 + 1 & 0xffff;
        } while ((int)uVar21 < (int)uVar9);
      }
      uVar1 = set->used;
      if (uVar1 != 0) {
        uVar19 = 1;
        idx = 0;
        uVar21 = 0;
LAB_0016cd7d:
        local_b8._0_4_ = LYXP_SET_EMPTY;
        plVar4 = (set->val).nodes;
        uVar13 = (ulong)((uVar21 & 0xffff) << 4);
        set_insert_node((lyxp_set *)local_b8,*(void **)((long)&plVar4->node + uVar13),
                        *(uint32_t *)((long)&plVar4->pos + uVar13),
                        *(lyxp_node_type *)((long)&plVar4->type + uVar13),0);
        *exp_idx = uVar7;
        set2.used = uVar19;
        set2.size = uVar1;
        if ((int)uVar9 < 1) {
          iVar10 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_b8,options);
          if (iVar10 != 0) goto LAB_0016d244;
        }
        else {
          uVar13 = 0;
          do {
            pvVar12 = *(void **)((long)__ptr + uVar13 * 8);
            if (pvVar12 != (void *)0x0) {
              bVar6 = 0;
              do {
                uVar15 = (ulong)bVar6;
                bVar6 = bVar6 + 1;
              } while (*(char *)((long)pvVar12 + uVar15) != '\0');
              memcpy(exp->repeat[(int)uVar13 + uVar8],pvVar12,(ulong)bVar6);
            }
            uVar16 = (int)uVar13 + 1U & 0xffff;
            uVar13 = (ulong)uVar16;
          } while ((int)uVar16 < (int)uVar9);
          iVar10 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_b8,options);
          if (iVar10 != 0) {
            if (0 < (int)uVar9) {
              lVar18 = 0;
              do {
                free(*(void **)((long)__ptr + lVar18 * 8));
                lVar18 = lVar18 + 1;
              } while ((uint)lVar18 < uVar9);
            }
LAB_0016d244:
            free(__ptr);
            goto LAB_0016cf63;
          }
        }
        if (local_b8._0_4_ == LYXP_SET_NUMBER) {
          lVar5 = ROUND((longdouble)set2._8_10_);
          set2._8_10_ = (longdouble)0;
          if ((long)lVar5 == (ulong)uVar19) {
            set2._8_10_ = (longdouble)1;
          }
        }
        lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_BOOLEAN,cur_node,param_4,options);
        if (set2._8_4_ == 0) {
          set_remove_node(set,idx);
        }
        else {
          uVar21 = uVar21 + 1;
        }
        uVar19 = uVar19 + 1;
        idx = uVar21 & 0xffff;
        if (set->used <= idx) goto LAB_0016cef4;
        goto LAB_0016cd7d;
      }
LAB_0016cef4:
      if (0 < (int)uVar9) {
        lVar18 = 0;
        do {
          free(*(void **)((long)__ptr + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while ((uint)lVar18 < uVar9);
      }
    }
    else {
      if (set->type != LYXP_SET_SNODE_SET) {
        local_b8._0_4_ = LYXP_SET_EMPTY;
        set_fill_set((lyxp_set *)local_b8,set);
        iVar10 = eval_expr(exp,exp_idx,cur_node,param_4,(lyxp_set *)local_b8,options);
        if (iVar10 != 0) {
LAB_0016cf63:
          lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_EMPTY,cur_node,param_4,options);
          return iVar10;
        }
        lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_BOOLEAN,cur_node,param_4,options);
        if (set2._8_4_ == 0) {
          lyxp_set_cast(set,LYXP_SET_EMPTY,cur_node,param_4,options);
        }
        lyxp_set_cast((lyxp_set *)local_b8,LYXP_SET_EMPTY,cur_node,param_4,options);
        goto LAB_0016d19d;
      }
      do {
        uVar8 = uVar8 + 1;
      } while (exp->tokens[uVar8 & 0xffff] != LYXP_TOKEN_BRACK2);
      uVar9 = (uint)uVar7;
      uVar8 = (uVar8 & 0xffff) - uVar9;
      __ptr = calloc((long)(int)uVar8,8);
      if (__ptr == (void *)0x0) goto LAB_0016cf70;
      if (0 < (int)uVar8) {
        ppuVar2 = exp->repeat;
        uVar21 = 0;
        do {
          puVar3 = ppuVar2[uVar21 + uVar9];
          if (puVar3 != (uint8_t *)0x0) {
            bVar6 = 0;
            do {
              uVar13 = (ulong)bVar6;
              bVar6 = bVar6 + 1;
            } while (puVar3[uVar13] != '\0');
            pvVar12 = malloc((ulong)bVar6);
            *(void **)((long)__ptr + (ulong)uVar21 * 8) = pvVar12;
            if (pvVar12 == (void *)0x0) {
LAB_0016cff4:
              pLVar14 = ly_errno_location();
              *pLVar14 = LY_EMEM;
              ly_log(LY_LLERR,"Memory allocation failed (%s()).","eval_predicate");
              free(__ptr);
              return -1;
            }
            memcpy(pvVar12,puVar3,(ulong)bVar6);
          }
          uVar21 = uVar21 + 1 & 0xffff;
        } while ((int)uVar21 < (int)uVar8);
      }
      uVar21 = set->used;
      uVar13 = (ulong)uVar21;
      if (uVar13 != 0) {
        uVar19 = 3;
        do {
          lVar18 = 0;
          while (uVar16 = *(uint *)((long)&((set->val).nodes)->pos + lVar18), uVar16 < uVar19) {
            lVar18 = lVar18 + 0x10;
            if (uVar13 << 4 == lVar18) {
              lVar18 = 0;
              do {
                if (*(int *)((long)&((set->val).nodes)->pos + lVar18) == 1) {
                  *(uint *)((long)&((set->val).nodes)->pos + lVar18) = uVar19;
                }
                lVar18 = lVar18 + 0x10;
              } while (uVar13 << 4 != lVar18);
              if (uVar21 != 0) {
                uVar21 = 0;
                do {
                  uVar21 = uVar21 & 0xffff;
                  if (*(uint *)((long)&((set->val).nodes)->pos + (ulong)(uVar21 << 4)) == uVar19) {
                    *(undefined4 *)((long)&((set->val).nodes)->pos + (ulong)(uVar21 << 4)) = 1;
                    *exp_idx = uVar7;
                    if ((int)uVar8 < 1) {
                      iVar10 = eval_expr(exp,exp_idx,cur_node,param_4,set,options);
                      if (iVar10 != 0) goto LAB_0016d283;
                    }
                    else {
                      uVar13 = 0;
                      do {
                        pvVar12 = *(void **)((long)__ptr + uVar13 * 8);
                        if (pvVar12 != (void *)0x0) {
                          bVar6 = 0;
                          do {
                            uVar15 = (ulong)bVar6;
                            bVar6 = bVar6 + 1;
                          } while (*(char *)((long)pvVar12 + uVar15) != '\0');
                          memcpy(exp->repeat[(int)uVar13 + uVar9],pvVar12,(ulong)bVar6);
                        }
                        uVar16 = (int)uVar13 + 1U & 0xffff;
                        uVar13 = (ulong)uVar16;
                      } while ((int)uVar16 < (int)uVar8);
                      iVar10 = eval_expr(exp,exp_idx,cur_node,param_4,set,options);
                      if (iVar10 != 0) {
                        if (0 < (int)uVar8) {
                          lVar18 = 0;
                          do {
                            free(*(void **)((long)__ptr + lVar18 * 8));
                            lVar18 = lVar18 + 1;
                          } while ((uint)lVar18 < uVar8);
                        }
LAB_0016d283:
                        free(__ptr);
                        return iVar10;
                      }
                    }
                    *(uint *)((long)&((set->val).nodes)->pos + (ulong)(uVar21 << 4)) = uVar19;
                    uVar13 = (ulong)set->used;
                  }
                  uVar21 = uVar21 + 1;
                  uVar16 = (uint)uVar13;
                } while ((uVar21 & 0xffff) < uVar16);
                if (uVar16 != 0) {
                  uVar9 = 0;
                  do {
                    uVar13 = (ulong)((uVar9 & 0xffff) << 4);
                    uVar21 = *(uint *)((long)&((set->val).nodes)->pos + uVar13);
                    uVar20 = 0;
                    if ((uVar21 == 1) || (uVar20 = 1, uVar21 == uVar19)) {
                      *(undefined4 *)((long)&((set->val).nodes)->pos + uVar13) = uVar20;
                    }
                    uVar9 = uVar9 + 1;
                  } while ((uVar9 & 0xffff) < uVar16);
                }
              }
              goto LAB_0016d175;
            }
          }
          uVar19 = uVar16 + 1;
        } while( true );
      }
LAB_0016d175:
      if (0 < (int)uVar8) {
        lVar18 = 0;
        do {
          free(*(void **)((long)__ptr + lVar18 * 8));
          lVar18 = lVar18 + 1;
        } while ((uint)lVar18 < uVar8);
      }
    }
    free(__ptr);
  }
LAB_0016d19d:
  uVar7 = *exp_idx;
  if ('\x02' < ly_log_level) {
    pcVar17 = "parsed";
    if (set == (lyxp_set *)0x0) {
      pcVar17 = "skipped";
    }
    pcVar11 = print_token(exp->tokens[uVar7]);
    ly_log_dbg(LY_LDGXPATH,"%-27s %s %s[%u]","eval_predicate",pcVar17,pcVar11,
               (ulong)exp->expr_pos[*exp_idx]);
    uVar7 = *exp_idx;
  }
  *exp_idx = uVar7 + 1;
  return 0;
}

Assistant:

static int
eval_predicate(struct lyxp_expr *exp, uint16_t *exp_idx, struct lyd_node *cur_node, struct lys_module *local_mod,
               struct lyxp_set *set, int options)
{
    int ret;
    uint16_t i, j, orig_exp, brack2_exp;
    uint32_t orig_pos, orig_size, pred_in_ctx;
    uint8_t **pred_repeat, rep_size;
    struct lyxp_set set2;

    /* '[' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    if (!set) {
        ret = eval_expr(exp, exp_idx, cur_node, local_mod, NULL, options);
        if (ret) {
            return ret;
        }
    } else if (set->type == LYXP_SET_NODE_SET) {
#ifndef NDEBUG
        /* we (possibly) need the set sorted, it can affect the result (if the predicate result is a number) */
        if (set_sort(set, cur_node, options) > 1) {
            LOGERR(LY_EINT, "XPath set was expected to be sorted, but is not (%s).", __func__);
        }
#endif

        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        orig_size = set->used;
        for (i = 0, orig_pos = 1; i < set->used; ++orig_pos) {
            set2.type = LYXP_SET_EMPTY;
            set_insert_node(&set2, set->val.nodes[i].node, set->val.nodes[i].pos, set->val.nodes[i].type, 0);
            /* remember the node context position for position() and context size for last() */
            set2.ctx_pos = orig_pos;
            set2.ctx_size = orig_size;
            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
                return ret;
            }

            /* number is a position */
            if (set2.type == LYXP_SET_NUMBER) {
                if ((long long)set2.val.num == orig_pos) {
                    set2.val.num = 1;
                } else {
                    set2.val.num = 0;
                }
            }
            lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);

            /* predicate satisfied or not? */
            if (set2.val.bool) {
                ++i;
            } else {
                set_remove_node(set, i);
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);

    } else if (set->type == LYXP_SET_SNODE_SET) {
        orig_exp = *exp_idx;

        /* find the predicate end */
        for (brack2_exp = orig_exp; exp->tokens[brack2_exp] != LYXP_TOKEN_BRACK2; ++brack2_exp);

        /* copy predicate repeats, since they get deleted each time (probably not an ideal solution) */
        pred_repeat = calloc(brack2_exp - orig_exp, sizeof *pred_repeat);
        if (!pred_repeat) {
            LOGMEM;
            return -1;
        }
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            if (exp->repeat[orig_exp + j]) {
                for (rep_size = 0; exp->repeat[orig_exp + j][rep_size]; ++rep_size);
                ++rep_size;
                pred_repeat[j] = malloc(rep_size * sizeof **pred_repeat);
                if (!pred_repeat[j]) {
                    LOGMEM;
                    for (i = 0; i < j; ++i) {
                        free(pred_repeat[j]);
                    }
                    free(pred_repeat);
                    return -1;
                }
                memcpy(pred_repeat[j], exp->repeat[orig_exp + j], rep_size * sizeof **pred_repeat);
            }
        }

        /* set special in_ctx to all the valid snodes */
        pred_in_ctx = set_snode_new_in_ctx(set);

        /* use the valid snodes one-by-one */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx != pred_in_ctx) {
                continue;
            }
            set->val.snodes[i].in_ctx = 1;

            *exp_idx = orig_exp;

            /* replace repeats */
            for (j = 0; j < brack2_exp - orig_exp; ++j) {
                if (pred_repeat[j]) {
                    for (rep_size = 0; pred_repeat[j][rep_size]; ++rep_size);
                    ++rep_size;
                    memcpy(exp->repeat[orig_exp + j], pred_repeat[j], rep_size * sizeof **pred_repeat);
                }
            }

            ret = eval_expr(exp, exp_idx, cur_node, local_mod, set, options);
            if (ret) {
                for (j = 0; j < brack2_exp - orig_exp; ++j) {
                    free(pred_repeat[j]);
                }
                free(pred_repeat);
                return ret;
            }

            set->val.snodes[i].in_ctx = pred_in_ctx;
        }

        /* restore the state as it was before the predicate */
        for (i = 0; i < set->used; ++i) {
            if (set->val.snodes[i].in_ctx == 1) {
                set->val.snodes[i].in_ctx = 0;
            } else if (set->val.snodes[i].in_ctx == pred_in_ctx) {
                set->val.snodes[i].in_ctx = 1;
            }
        }

        /* free predicate repeats */
        for (j = 0; j < brack2_exp - orig_exp; ++j) {
            free(pred_repeat[j]);
        }
        free(pred_repeat);
    } else {
        set2.type = LYXP_SET_EMPTY;
        set_fill_set(&set2, set);

        ret = eval_expr(exp, exp_idx, cur_node, local_mod, &set2, options);
        if (ret) {
            lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
            return ret;
        }

        lyxp_set_cast(&set2, LYXP_SET_BOOLEAN, cur_node, local_mod, options);
        if (!set2.val.bool) {
            lyxp_set_cast(set, LYXP_SET_EMPTY, cur_node, local_mod, options);
        }
        lyxp_set_cast(&set2, LYXP_SET_EMPTY, cur_node, local_mod, options);
    }

    /* ']' */
    LOGDBG(LY_LDGXPATH, "%-27s %s %s[%u]", __func__, (set ? "parsed" : "skipped"),
           print_token(exp->tokens[*exp_idx]), exp->expr_pos[*exp_idx]);
    ++(*exp_idx);

    return EXIT_SUCCESS;
}